

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

int AF_AActor_LineAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double distance_00;
  int damage_00;
  DAngle t1;
  VMValue *pVVar1;
  bool bVar2;
  bool local_9a;
  bool local_97;
  FName local_94;
  TAngle<double> local_90;
  TAngle<double> local_88;
  AActor *local_80;
  AActor *puff;
  FTranslatedLineTarget *pFStack_70;
  int acdmg;
  FTranslatedLineTarget *victim;
  PClassActor *pPStack_60;
  int flags;
  MetaClass *puffType;
  FName damageType;
  int damage;
  DAngle pitch;
  double distance;
  DAngle angle;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11db,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11db,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  angle.Degrees = *(double *)&param->field_0;
  local_97 = true;
  if ((DObject *)angle.Degrees != (DObject *)0x0) {
    local_97 = DObject::IsKindOf((DObject *)angle.Degrees,AActor::RegistrationInfo.MyClass);
  }
  if (local_97 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11db,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dc,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dc,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  TAngle<double>::TAngle((TAngle<double> *)&distance,param[1].field_0.f);
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dd,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11dd,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  distance_00 = param[2].field_0.f;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11de,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11de,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  TAngle<double>::TAngle((TAngle<double> *)&damageType,param[3].field_0.f);
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11df,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11df,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  puffType._4_4_ = param[4].field_0.i;
  if (numparam < 6) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e0,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e0,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  FName::FName((FName *)&puffType,param[5].field_0.i);
  if (numparam < 7) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x11e1,
                  "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if ((param[6].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[6].field_0.field_1.atag != 1)) {
    bVar2 = param[6].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    pPStack_60 = (PClassActor *)param[6].field_0.field_1.a;
    local_9a = true;
    if (pPStack_60 != (PClassActor *)0x0) {
      local_9a = PClass::IsDescendantOf((PClass *)pPStack_60,AActor::RegistrationInfo.MyClass);
    }
    if (local_9a == false) {
      __assert_fail("puffType == NULL || puffType->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x11e1,
                    "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 8) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x11e2,
                      "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
      victim._4_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[7].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x11e2,
                      "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      victim._4_4_ = param[7].field_0.i;
    }
    if (numparam < 9) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      bVar2 = false;
      if ((pVVar1->field_0).field_3.Type == '\x03') {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
        bVar2 = (pVVar1->field_0).field_1.atag == 0;
      }
      if (!bVar2) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x11e3,
                      "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
      pFStack_70 = (FTranslatedLineTarget *)(pVVar1->field_0).field_1.a;
    }
    else {
      bVar2 = false;
      if (param[8].field_0.field_3.Type == '\x03') {
        bVar2 = param[8].field_0.field_1.atag == 0;
      }
      if (!bVar2) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0x11e3,
                      "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pFStack_70 = (FTranslatedLineTarget *)param[8].field_0.field_1.a;
    }
    if (pPStack_60 == (PClassActor *)0x0) {
      pPStack_60 = PClass::FindActor("BulletPuff");
    }
    t1.Degrees = angle.Degrees;
    TAngle<double>::TAngle(&local_88,(TAngle<double> *)&distance);
    TAngle<double>::TAngle(&local_90,(TAngle<double> *)&damageType);
    damage_00 = puffType._4_4_;
    FName::FName(&local_94,(FName *)&puffType);
    local_80 = P_LineAttack((AActor *)t1.Degrees,&local_88,distance_00,&local_90,damage_00,&local_94
                            ,pPStack_60,victim._4_4_,pFStack_70,(int *)((long)&puff + 4));
    if (0 < numret) {
      VMReturn::SetPointer(ret,local_80,1);
    }
    self._4_4_ = numret;
    if (1 < numret) {
      VMReturn::SetInt(ret + 1,puff._4_4_);
      self._4_4_ = 2;
    }
    return self._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x11e1,
                "int AF_AActor_LineAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, LineAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE(angle);
	PARAM_FLOAT(distance);
	PARAM_ANGLE(pitch);
	PARAM_INT(damage);
	PARAM_NAME(damageType);
	PARAM_CLASS(puffType, AActor);
	PARAM_INT_DEF(flags);
	PARAM_POINTER_DEF(victim, FTranslatedLineTarget);

	int acdmg;
	if (puffType == nullptr) puffType = PClass::FindActor("BulletPuff");	// P_LineAttack does not work without a puff to take info from.
	auto puff = P_LineAttack(self, angle, distance, pitch, damage, damageType, puffType, flags, victim, &acdmg);
	if (numret > 0) ret[0].SetPointer(puff, ATAG_OBJECT);
	if (numret > 1) ret[1].SetInt(acdmg), numret = 2;
	return numret;
}